

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QPixmap>::moveAppend
          (QGenericArrayOps<QPixmap> *this,QPixmap *b,QPixmap *e)

{
  QPixmap *this_00;
  ulong in_RDX;
  ulong in_RSI;
  QPixmap *in_RDI;
  QPixmap *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QPixmap>::begin((QArrayDataPointer<QPixmap> *)0x319127);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QPixmap::QPixmap(this_00,in_RDI);
      local_10 = local_10 + 0x18;
      (in_RDI->data).d.ptr =
           (QPlatformPixmap *)((long)&((in_RDI->data).d.ptr)->_vptr_QPlatformPixmap + 1);
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }